

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

int __thiscall
google::protobuf::UninterpretedOption_NamePart::ByteSize(UninterpretedOption_NamePart *this)

{
  byte bVar1;
  string *psVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint value;
  
  bVar1 = (byte)this->_has_bits_[0];
  uVar6 = (uint)bVar1;
  if (bVar1 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    if ((bVar1 & 1) != 0) {
      psVar2 = this->name_part_;
      value = (uint)psVar2->_M_string_length;
      iVar4 = 1;
      uVar6 = (uint)bVar1;
      if (0x7f < value) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(value);
        value = (uint)psVar2->_M_string_length;
        uVar6 = this->_has_bits_[0];
      }
      iVar4 = iVar4 + value + 1;
    }
    iVar4 = (uVar6 & 2) + iVar4;
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar5 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar4 + iVar5;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int UninterpretedOption_NamePart::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // required string name_part = 1;
    if (has_name_part()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name_part());
    }

    // required bool is_extension = 2;
    if (has_is_extension()) {
      total_size += 1 + 1;
    }

  }
  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}